

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  bool bVar1;
  char *pcVar2;
  long in_RSI;
  UInt digit;
  Char c;
  LargestUInt value;
  LargestUInt threshold;
  LargestUInt maxIntegerValue;
  bool isNegative;
  Location current;
  Value *in_stack_00000168;
  Token *in_stack_00000170;
  Reader *in_stack_00000178;
  Value *in_stack_fffffffffffffec8;
  Value *pVVar3;
  Value *in_stack_fffffffffffffed0;
  ulong local_110;
  ValueHolder in_stack_ffffffffffffff00;
  Value local_d8 [3];
  uint local_50;
  char local_49;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  undefined1 local_29;
  char *local_28;
  
  local_28 = *(char **)(in_RSI + 8);
  local_29 = *local_28 == '-';
  if ((bool)local_29) {
    local_28 = local_28 + 1;
    local_110 = 0x8000000000000000;
  }
  else {
    local_110 = 0xffffffffffffffff;
  }
  local_38 = local_110;
  local_40 = local_110 / 10;
  local_48 = 0;
  while( true ) {
    if (*(char **)(in_RSI + 0x10) <= local_28) {
      if (((bool)local_29) && (local_48 == local_110)) {
        Value::Value(in_stack_fffffffffffffed0,(Int64)in_stack_fffffffffffffec8);
        Value::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        Value::~Value((Value *)in_stack_ffffffffffffff00.map_);
      }
      else if ((bool)local_29) {
        Value::Value(in_stack_fffffffffffffed0,(Int64)in_stack_fffffffffffffec8);
        Value::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        Value::~Value((Value *)in_stack_ffffffffffffff00.map_);
      }
      else if (local_48 < 0x80000000) {
        pVVar3 = local_d8;
        Value::Value(pVVar3,(Int64)in_stack_fffffffffffffec8);
        Value::operator=(pVVar3,in_stack_fffffffffffffec8);
        Value::~Value((Value *)in_stack_ffffffffffffff00.map_);
      }
      else {
        pVVar3 = (Value *)&stack0xffffffffffffff00;
        Value::Value(in_stack_fffffffffffffed0,(UInt64)pVVar3);
        Value::operator=(in_stack_fffffffffffffed0,pVVar3);
        Value::~Value((Value *)in_stack_ffffffffffffff00.map_);
      }
      return true;
    }
    pcVar2 = local_28 + 1;
    local_49 = *local_28;
    local_28 = pcVar2;
    if ((local_49 < '0') || ('9' < local_49)) break;
    local_50 = (int)local_49 - 0x30;
    if ((local_40 <= local_48) &&
       (((local_40 < local_48 || (pcVar2 != *(char **)(in_RSI + 0x10))) ||
        (local_110 % 10 < (ulong)local_50)))) {
      bVar1 = decodeDouble(in_stack_00000178,in_stack_00000170,in_stack_00000168);
      return bVar1;
    }
    local_48 = local_48 * 10 + (ulong)local_50;
  }
  bVar1 = decodeDouble(in_stack_00000178,in_stack_00000170,in_stack_00000168);
  return bVar1;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(Value::maxLargestInt) + 1
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative && value == maxIntegerValue)
    decoded = Value::minLargestInt;
  else if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}